

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O0

unique_ptr<Catch::Generators::SingleValueGenerator<long>_> __thiscall
Catch::Detail::make_unique<Catch::Generators::SingleValueGenerator<long>,long>
          (Detail *this,long *args)

{
  SingleValueGenerator<long> *this_00;
  long *args_local;
  
  this_00 = (SingleValueGenerator<long> *)operator_new(0x38);
  Catch::Generators::SingleValueGenerator<long>::SingleValueGenerator(this_00,args);
  unique_ptr<Catch::Generators::SingleValueGenerator<long>_>::unique_ptr
            ((unique_ptr<Catch::Generators::SingleValueGenerator<long>_> *)this,this_00);
  return (unique_ptr<Catch::Generators::SingleValueGenerator<long>_>)
         (SingleValueGenerator<long> *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }